

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdSArray.h
# Opt level: O2

void __thiscall HACD::SArray<long,_16UL>::Resize(SArray<long,_16UL> *this,size_t size)

{
  ulong uVar1;
  SArray<long,_16UL> *pSVar2;
  long *__dest;
  SArray<long,_16UL> *__src;
  
  uVar1 = this->m_maxSize;
  if (uVar1 < size) {
    __dest = (long *)operator_new__(-(ulong)(size >> 0x3d != 0) | size * 8);
    pSVar2 = (SArray<long,_16UL> *)this->m_data;
    __src = pSVar2;
    if (uVar1 == 0x10) {
      __src = this;
    }
    memcpy(__dest,__src,this->m_size << 3);
    if (pSVar2 != (SArray<long,_16UL> *)0x0) {
      operator_delete__(pSVar2);
    }
    this->m_data = __dest;
    this->m_maxSize = size;
  }
  return;
}

Assistant:

void                    Resize(size_t size)
									{
										if (size > m_maxSize)
										{
                                            T * temp = new T[size];
											memcpy(temp, Data(), m_size*sizeof(T));
                                            delete [] m_data;
                                            m_data = temp;
                                            m_maxSize = size;
										}
									}